

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::CFG(CFG *this,Addr addr)

{
  _Rb_tree_header *p_Var1;
  CfgNode *this_00;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_001179d8;
  this->m_addr = addr;
  this->m_status = UNCHECKED;
  (this->m_functionName)._M_dataplus._M_p = (pointer)&(this->m_functionName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_functionName,"unknown","");
  this_00 = (CfgNode *)operator_new(0x78);
  CfgNode::CfgNode(this_00,CFG_ENTRY);
  this->m_entryNode = this_00;
  p_Var1 = &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->m_exitNode = (CfgNode *)0x0;
  this->m_haltNode = (CfgNode *)0x0;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

CFG::CFG(Addr addr) : m_addr(addr), m_status(CFG::UNCHECKED),
		m_functionName("unknown"),
		m_entryNode(new CfgNode(CfgNode::CFG_ENTRY)),
		m_exitNode(0), m_haltNode(0) {
}